

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int int1;
  uint uVar6;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  int *piVar9;
  
  iVar2 = ctxt->nameNr;
  iVar3 = ctxt->spaceNr;
  iVar4 = ctxt->nodeNr;
  pxVar8 = ctxt->input;
  while( true ) {
    if (((pxVar8->flags & 0x40) == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar7 = ctxt->input->cur;
    if ((ctxt->input->end <= pxVar7) || (1 < ctxt->disableSAX)) break;
    xVar1 = *pxVar7;
    if (xVar1 == '<') {
      if (pxVar7[1] == '?') {
        xmlParsePI(ctxt);
      }
      else if ((((pxVar7[1] == '!') && (pxVar7[2] == '[')) && (pxVar7[3] == 'C')) &&
              (((pxVar7[4] == 'D' && (pxVar7[5] == 'A')) &&
               ((pxVar7[6] == 'T' && ((pxVar7[7] == 'A' && (pxVar7[8] == '[')))))))) {
        xmlParseCDSect(ctxt);
      }
      else {
        if ((pxVar7[1] != '!') || ((pxVar7[2] != '-' || (pxVar7[3] != '-')))) goto LAB_0013c34c;
        xmlParseComment(ctxt);
      }
    }
    else {
LAB_0013c34c:
      if (xVar1 == '&') {
        xmlParseReference(ctxt);
      }
      else if (xVar1 == '<') {
        if (pxVar7[1] == '/') {
          if (ctxt->nameNr <= iVar2) break;
          xmlParseElementEnd(ctxt);
        }
        else {
          xmlParseElementStart(ctxt);
        }
      }
      else {
        xmlParseCharDataInternal(ctxt,0);
      }
    }
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
    pxVar8 = ctxt->input;
  }
  iVar5 = ctxt->nameNr;
  if (((iVar2 < iVar5) && (ctxt->input->end <= ctxt->input->cur)) && (ctxt->wellFormed != 0)) {
    int1 = ctxt->pushTab[(long)iVar5 + -1].line;
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NOT_FINISHED,XML_ERR_FATAL,
               ctxt->nameTab[(long)iVar5 + -1],(xmlChar *)0x0,(xmlChar *)0x0,int1,
               "Premature end of data in tag %s line %d\n",ctxt->nameTab[(long)iVar5 + -1],int1,0);
  }
  while (iVar4 < ctxt->nodeNr) {
    nodePop(ctxt);
  }
  while (iVar2 < ctxt->nameNr) {
    iVar4 = ctxt->pushTab[(long)ctxt->nameNr + -1].nsNr;
    if (iVar4 != 0) {
      xmlParserNsPop(ctxt,iVar4);
    }
    namePop(ctxt);
  }
  while( true ) {
    uVar6 = ctxt->spaceNr;
    if ((int)uVar6 <= iVar3) break;
    if (0 < (int)uVar6) {
      ctxt->spaceNr = uVar6 - 1;
      if (uVar6 == 1) {
        piVar9 = ctxt->spaceTab;
      }
      else {
        piVar9 = ctxt->spaceTab + ((ulong)uVar6 - 2);
      }
      ctxt->space = piVar9;
      ctxt->spaceTab[(int)(uVar6 - 1)] = -1;
    }
  }
  return;
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int oldNameNr = ctxt->nameNr;
    int oldSpaceNr = ctxt->spaceNr;
    int oldNodeNr = ctxt->nodeNr;

    GROW;
    while ((ctxt->input->cur < ctxt->input->end) &&
	   (PARSER_STOPPED(ctxt) == 0)) {
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= oldNameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharDataInternal(ctxt, 0);
	}

	SHRINK;
	GROW;
    }

    if ((ctxt->nameNr > oldNameNr) &&
        (ctxt->input->cur >= ctxt->input->end) &&
        (ctxt->wellFormed)) {
        const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
        int line = ctxt->pushTab[ctxt->nameNr - 1].line;
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                "Premature end of data in tag %s line %d\n",
                name, line, NULL);
    }

    /*
     * Clean up in error case
     */

    while (ctxt->nodeNr > oldNodeNr)
        nodePop(ctxt);

    while (ctxt->nameNr > oldNameNr) {
        xmlStartTag *tag = &ctxt->pushTab[ctxt->nameNr - 1];

        if (tag->nsNr != 0)
            xmlParserNsPop(ctxt, tag->nsNr);

        namePop(ctxt);
    }

    while (ctxt->spaceNr > oldSpaceNr)
        spacePop(ctxt);
}